

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockingqueue.hpp
# Opt level: O1

function<void_()> * __thiscall
BlockingQueue<std::function<void_()>_>::pop
          (function<void_()> *__return_storage_ptr__,BlockingQueue<std::function<void_()>_> *this)

{
  _Elt_pointer pIVar1;
  _Manager_type p_Var2;
  Item item;
  unique_lock<std::mutex> lock;
  _Any_data local_58;
  _Manager_type local_48;
  _Invoker_type p_Stack_40;
  ulong local_38;
  unique_lock<std::mutex> local_30;
  
  local_30._M_owns = false;
  local_30._M_device = &this->mutex;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  if ((this->items).c.
      super__Deque_base<BlockingQueue<std::function<void_()>_>::Item,_std::allocator<BlockingQueue<std::function<void_()>_>::Item>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      (this->items).c.
      super__Deque_base<BlockingQueue<std::function<void_()>_>::Item,_std::allocator<BlockingQueue<std::function<void_()>_>::Item>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      std::condition_variable::wait((unique_lock *)&this->itemsNotEmpty);
    } while ((this->items).c.
             super__Deque_base<BlockingQueue<std::function<void_()>_>::Item,_std::allocator<BlockingQueue<std::function<void_()>_>::Item>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
             (this->items).c.
             super__Deque_base<BlockingQueue<std::function<void_()>_>::Item,_std::allocator<BlockingQueue<std::function<void_()>_>::Item>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  pIVar1 = (this->items).c.
           super__Deque_base<BlockingQueue<std::function<void_()>_>::Item,_std::allocator<BlockingQueue<std::function<void_()>_>::Item>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_48 = (_Manager_type)0x0;
  p_Stack_40 = (pIVar1->value)._M_invoker;
  p_Var2 = (pIVar1->value).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    local_58._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(pIVar1->value).super__Function_base._M_functor;
    local_58._8_8_ = *(undefined8 *)((long)&(pIVar1->value).super__Function_base._M_functor + 8);
    (pIVar1->value).super__Function_base._M_manager = (_Manager_type)0x0;
    (pIVar1->value)._M_invoker = (_Invoker_type)0x0;
    local_48 = p_Var2;
  }
  local_38 = pIVar1->size;
  std::
  deque<BlockingQueue<std::function<void_()>_>::Item,_std::allocator<BlockingQueue<std::function<void_()>_>::Item>_>
  ::pop_front(&(this->items).c);
  if (local_38 != 0) {
    if (this->totalSize < local_38) {
      __assert_fail("totalSize >= item.size",
                    "/workspace/llm4binary/github/license_c_cmakelists/zeux[P]qgrep/src/blockingqueue.hpp"
                    ,0x2e,
                    "T BlockingQueue<std::function<void ()>>::pop() [T = std::function<void ()>]");
    }
    this->totalSize = this->totalSize - local_38;
    std::unique_lock<std::mutex>::unlock(&local_30);
    std::condition_variable::notify_all();
  }
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = p_Stack_40;
  if (local_48 != (_Manager_type)0x0) {
    *(void **)&(__return_storage_ptr__->super__Function_base)._M_functor =
         local_58._M_unused._M_object;
    *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) =
         local_58._8_8_;
    (__return_storage_ptr__->super__Function_base)._M_manager = local_48;
    local_48 = (_Manager_type)0x0;
    p_Stack_40 = (_Invoker_type)0x0;
  }
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return __return_storage_ptr__;
}

Assistant:

T pop()
	{
		std::unique_lock<std::mutex> lock(mutex);

		itemsNotEmpty.wait(lock, [&]() { return !items.empty(); });

		Item item = std::move(items.front());
		items.pop();

		if (item.size > 0)
		{
			assert(totalSize >= item.size);
			totalSize -= item.size;

			lock.unlock();
			itemsNotFull.notify_all();
		}

		return std::move(item.value);
	}